

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall google::protobuf::descriptor_unittest::HasHasbitTest::SetUp(HasHasbitTest *this)

{
  bool bVar1;
  ParamType *this_00;
  char *message;
  FileDescriptor *pFVar2;
  char *in_R9;
  string_view input;
  string local_78;
  AssertHelper local_58 [3];
  Message local_40;
  undefined1 local_38 [16];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  HasHasbitTest *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  this_00 = testing::WithParamInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>::
            GetParam();
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  input._M_str = &this->foo_proto_;
  input._M_len = local_38._8_8_;
  local_21 = TextFormat::ParseFromString(local_38._0_8_,input,(Message *)local_38._0_8_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_20,
               (AssertionResult *)
               "TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_)","false","true"
               ,in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xc84,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (bVar1) {
    pFVar2 = DescriptorPool::BuildFile(&this->pool_,&this->foo_proto_);
    this->foo_ = pFVar2;
  }
  return;
}

Assistant:

void SetUp() override {
    ASSERT_TRUE(
        TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_));
    foo_ = pool_.BuildFile(foo_proto_);
  }